

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

void __thiscall tcu::TextureCube::allocLevel(TextureCube *this,CubeFace face,int levelNdx)

{
  void *pvVar1;
  TextureFormat format;
  pointer pPVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = this->m_size >> ((byte)levelNdx & 0x1f);
  iVar4 = 1;
  if (1 < iVar3) {
    iVar4 = iVar3;
  }
  iVar3 = getPixelSize(this->m_format);
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage
            (this->m_data[face].
             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start + levelNdx,(long)(iVar3 * iVar4 * iVar4));
  pvVar1 = this->m_data[face].
           super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[levelNdx].m_ptr;
  format = this->m_format;
  iVar3 = getPixelSize(format);
  pPVar2 = this->m_access[face].
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  *(TextureFormat *)(pPVar2 + levelNdx) = format;
  *(int *)((long)(pPVar2 + levelNdx) + 8) = iVar4;
  *(int *)((long)(pPVar2 + levelNdx) + 0xc) = iVar4;
  *(int *)((long)(pPVar2 + levelNdx) + 0x10) = 1;
  *(int *)((long)(pPVar2 + levelNdx) + 0x14) = iVar3;
  *(int *)((long)(pPVar2 + levelNdx) + 0x18) = iVar3 * iVar4;
  *(int *)((long)(pPVar2 + levelNdx) + 0x1c) = iVar3 * iVar4 * iVar4;
  *(void **)((long)(pPVar2 + levelNdx) + 0x20) = pvVar1;
  return;
}

Assistant:

void TextureCube::allocLevel (tcu::CubeFace face, int levelNdx)
{
	const int	size		= getMipPyramidLevelSize(m_size, levelNdx);
	const int	dataSize	= m_format.getPixelSize()*size*size;
	DE_ASSERT(isLevelEmpty(face, levelNdx));

	m_data[face][levelNdx].setStorage(dataSize);
	m_access[face][levelNdx] = PixelBufferAccess(m_format, size, size, 1, m_data[face][levelNdx].getPtr());
}